

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_layout_row_begin(nk_context *ctx,nk_layout_format fmt,float row_height,int cols)

{
  nk_window *win;
  nk_panel *pnVar1;
  
  if (((ctx != (nk_context *)0x0) && (win = ctx->current, win != (nk_window *)0x0)) &&
     (pnVar1 = win->layout, pnVar1 != (nk_panel *)0x0)) {
    nk_panel_layout(ctx,win,row_height,cols);
    (pnVar1->row).type = (uint)(fmt != NK_DYNAMIC) * 4 + NK_LAYOUT_DYNAMIC_ROW;
    (pnVar1->row).ratio = (float *)0x0;
    (pnVar1->row).item_width = 0.0;
    (pnVar1->row).item_offset = 0.0;
    (pnVar1->row).filled = 0.0;
    (pnVar1->row).columns = cols;
  }
  return;
}

Assistant:

NK_API void
nk_layout_row_begin(struct nk_context *ctx, enum nk_layout_format fmt,
float row_height, int cols)
{
struct nk_window *win;
struct nk_panel *layout;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return;

win = ctx->current;
layout = win->layout;
nk_panel_layout(ctx, win, row_height, cols);
if (fmt == NK_DYNAMIC)
layout->row.type = NK_LAYOUT_DYNAMIC_ROW;
else layout->row.type = NK_LAYOUT_STATIC_ROW;

layout->row.ratio = 0;
layout->row.filled = 0;
layout->row.item_width = 0;
layout->row.item_offset = 0;
layout->row.columns = cols;
}